

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darknet2ncnn.cpp
# Opt level: O3

string * trim(string *s)

{
  char *pcVar1;
  char *pcVar2;
  pointer pcVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  pointer pcVar7;
  char *pcVar8;
  pointer pcVar9;
  char *pcVar10;
  pointer pcVar11;
  
  pcVar2 = (s->_M_dataplus)._M_p;
  uVar6 = s->_M_string_length;
  pcVar1 = pcVar2 + uVar6;
  pcVar8 = pcVar2;
  if (0 < (long)uVar6 >> 2) {
    pcVar8 = pcVar2 + (uVar6 & 0xfffffffffffffffc);
    lVar5 = ((long)uVar6 >> 2) + 1;
    pcVar10 = pcVar2 + 3;
    do {
      iVar4 = isspace((int)pcVar10[-3]);
      if (iVar4 == 0) {
        pcVar10 = pcVar10 + -3;
        goto LAB_001042c8;
      }
      iVar4 = isspace((int)pcVar10[-2]);
      if (iVar4 == 0) {
        pcVar10 = pcVar10 + -2;
        goto LAB_001042c8;
      }
      iVar4 = isspace((int)pcVar10[-1]);
      if (iVar4 == 0) {
        pcVar10 = pcVar10 + -1;
        goto LAB_001042c8;
      }
      iVar4 = isspace((int)*pcVar10);
      if (iVar4 == 0) goto LAB_001042c8;
      lVar5 = lVar5 + -1;
      pcVar10 = pcVar10 + 4;
    } while (1 < lVar5);
  }
  lVar5 = (long)pcVar1 - (long)pcVar8;
  if (lVar5 == 1) {
LAB_001042a4:
    iVar4 = isspace((int)*pcVar8);
    pcVar10 = pcVar8;
    if (iVar4 != 0) {
      pcVar10 = pcVar1;
    }
LAB_001042c8:
    if (pcVar1 == pcVar10) goto LAB_001042df;
    std::__cxx11::string::_M_erase((ulong)s,0);
  }
  else {
    if (lVar5 == 2) {
LAB_00104293:
      iVar4 = isspace((int)*pcVar8);
      pcVar10 = pcVar8;
      if (iVar4 != 0) {
        pcVar8 = pcVar8 + 1;
        goto LAB_001042a4;
      }
      goto LAB_001042c8;
    }
    if (lVar5 == 3) {
      iVar4 = isspace((int)*pcVar8);
      pcVar10 = pcVar8;
      if (iVar4 != 0) {
        pcVar8 = pcVar8 + 1;
        goto LAB_00104293;
      }
      goto LAB_001042c8;
    }
LAB_001042df:
    s->_M_string_length = 0;
    *pcVar2 = '\0';
  }
  pcVar3 = (s->_M_dataplus)._M_p;
  uVar6 = s->_M_string_length;
  pcVar9 = pcVar3 + uVar6;
  lVar5 = (long)uVar6 >> 2;
  pcVar11 = pcVar9;
  if (0 < lVar5) {
    pcVar11 = pcVar9 + -(uVar6 & 0xfffffffffffffffc);
    pcVar9 = pcVar9 + lVar5 * -4;
    lVar5 = lVar5 + 1;
    do {
      iVar4 = isspace((int)pcVar3[uVar6 - 1]);
      if (iVar4 == 0) {
        pcVar7 = pcVar3 + uVar6;
        goto LAB_00104405;
      }
      iVar4 = isspace((int)pcVar3[uVar6 - 2]);
      if (iVar4 == 0) {
        pcVar7 = pcVar3 + (uVar6 - 1);
        goto LAB_00104405;
      }
      iVar4 = isspace((int)pcVar3[uVar6 - 3]);
      if (iVar4 == 0) {
        pcVar7 = pcVar3 + (uVar6 - 2);
        goto LAB_00104405;
      }
      iVar4 = isspace((int)pcVar3[uVar6 - 4]);
      if (iVar4 == 0) {
        pcVar7 = pcVar3 + (uVar6 - 3);
        goto LAB_00104405;
      }
      uVar6 = uVar6 - 4;
      lVar5 = lVar5 + -1;
    } while (1 < lVar5);
  }
  lVar5 = (long)pcVar11 - (long)pcVar3;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      pcVar7 = pcVar3;
      if ((lVar5 != 3) || (iVar4 = isspace((int)pcVar11[-1]), pcVar7 = pcVar11, iVar4 == 0))
      goto LAB_00104405;
      pcVar11 = pcVar9 + -1;
      pcVar9 = pcVar11;
    }
    iVar4 = isspace((int)pcVar11[-1]);
    pcVar7 = pcVar11;
    if (iVar4 == 0) goto LAB_00104405;
    pcVar11 = pcVar9 + -1;
  }
  iVar4 = isspace((int)pcVar11[-1]);
  pcVar7 = pcVar11;
  if (iVar4 != 0) {
    pcVar7 = pcVar3;
  }
LAB_00104405:
  s->_M_string_length = (long)pcVar7 - (long)pcVar3;
  *pcVar7 = '\0';
  return s;
}

Assistant:

static inline std::string& trim(std::string& s)
{
    s.erase(s.begin(), std::find_if(s.begin(), s.end(), [](int ch) {
        return !std::isspace(ch);
    }));
    s.erase(std::find_if(s.rbegin(), s.rend(), [](int ch) {
        return !std::isspace(ch);
    }).base(),
    s.end());
    return s;
}